

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6295.c
# Opt level: O3

void okim6295_alloc_rom(void *info,UINT32 memsize)

{
  void *__s;
  okim6295_state *chip;
  
  if (*(UINT32 *)((long)info + 0xfc) == memsize) {
    return;
  }
  __s = realloc(*(void **)((long)info + 0x100),(ulong)memsize);
  *(void **)((long)info + 0x100) = __s;
  *(UINT32 *)((long)info + 0xfc) = memsize;
  memset(__s,0xff,(ulong)memsize);
  return;
}

Assistant:

static void okim6295_alloc_rom(void* info, UINT32 memsize)
{
	okim6295_state *chip = (okim6295_state *)info;
	
	if (chip->ROMSize == memsize)
		return;
	
	chip->ROM = (UINT8*)realloc(chip->ROM, memsize);
	chip->ROMSize = memsize;
	memset(chip->ROM, 0xFF, chip->ROMSize);
	
	return;
}